

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_core.hpp
# Opt level: O3

void __thiscall
iutest::detail::TestInstance<iu_ParamMethod_Foo_x_Test_DISABLED_EQ79>::TestInstance
          (TestInstance<iu_ParamMethod_Foo_x_Test_DISABLED_EQ79> *this,string *testsuite,char *name,
          char *value_params,TestTypeId id,SetUpMethod setup,TearDownMethod teardown)

{
  char *pcVar1;
  UnitTest *pUVar2;
  TestSuite *pTVar3;
  allocator<char> local_51;
  string local_50;
  
  pUVar2 = UnitTest::instance();
  pTVar3 = UnitTestImpl::AddTestSuite<iutest::TestSuite>
                     (&pUVar2->super_UnitTestImpl,testsuite,id,setup,teardown);
  (this->m_mediator).super_iuITestSuiteMediator.m_test_suite = pTVar3;
  (this->m_mediator).super_iuITestSuiteMediator._vptr_iuITestSuiteMediator =
       (_func_int **)&PTR__iuITestSuiteMediator_00146e08;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,name,&local_51);
  TestInfo::TestInfo(&this->m_info,(iuITestSuiteMediator *)this,&local_50,
                     &(this->m_factory).super_iuFactoryBase);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (this->m_factory).super_iuFactoryBase._vptr_iuFactoryBase =
       (_func_int **)&PTR__iuFactoryBase_00147598;
  pcVar1 = (char *)(this->m_info).m_value_param._M_string_length;
  strlen(value_params);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->m_info).m_value_param,0,pcVar1,(ulong)value_params);
  pUVar2 = UnitTest::instance();
  pTVar3 = (this->m_mediator).super_iuITestSuiteMediator.m_test_suite;
  (pUVar2->super_UnitTestImpl).m_total_test_num = (pUVar2->super_UnitTestImpl).m_total_test_num + 1;
  TestSuite::push_back(pTVar3,&this->m_info);
  return;
}

Assistant:

TestInstance(const ::std::string& testsuite, const char* name, const char*  value_params, TestTypeId id
        , SetUpMethod setup, TearDownMethod teardown)
        : m_mediator(AddTestSuite(testsuite, id, setup, teardown))
        , m_info(&m_mediator, name, &m_factory)
    {
        m_info.set_value_param(value_params);
        UnitTest::instance().AddTestInfo(m_mediator.ptr(), &m_info);
    }